

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_lib.c
# Opt level: O0

void engine_set_all_null(ENGINE *e)

{
  ENGINE *e_local;
  
  e->id = (char *)0x0;
  e->name = (char *)0x0;
  e->rsa_meth = (RSA_METHOD *)0x0;
  e->dsa_meth = (DSA_METHOD *)0x0;
  e->dh_meth = (DH_METHOD *)0x0;
  e->rand_meth = (RAND_METHOD *)0x0;
  e->ciphers = (ENGINE_CIPHERS_PTR)0x0;
  e->digests = (ENGINE_DIGESTS_PTR)0x0;
  e->destroy = (ENGINE_GEN_INT_FUNC_PTR)0x0;
  e->init = (ENGINE_GEN_INT_FUNC_PTR)0x0;
  e->finish = (ENGINE_GEN_INT_FUNC_PTR)0x0;
  e->ctrl = (ENGINE_CTRL_FUNC_PTR)0x0;
  e->load_privkey = (ENGINE_LOAD_KEY_PTR)0x0;
  e->load_pubkey = (ENGINE_LOAD_KEY_PTR)0x0;
  e->cmd_defns = (ENGINE_CMD_DEFN *)0x0;
  e->flags = 0;
  e->dynamic_id = (ENGINE_DYNAMIC_ID)0x0;
  return;
}

Assistant:

void engine_set_all_null(ENGINE *e)
{
    e->id = NULL;
    e->name = NULL;
    e->rsa_meth = NULL;
    e->dsa_meth = NULL;
    e->dh_meth = NULL;
    e->rand_meth = NULL;
    e->ciphers = NULL;
    e->digests = NULL;
    e->destroy = NULL;
    e->init = NULL;
    e->finish = NULL;
    e->ctrl = NULL;
    e->load_privkey = NULL;
    e->load_pubkey = NULL;
    e->cmd_defns = NULL;
    e->flags = 0;
    e->dynamic_id = NULL;
}